

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O1

void __thiscall
spvtools::FriendlyNameMapper::FriendlyNameMapper
          (FriendlyNameMapper *this,spv_const_context context,uint32_t *code,size_t wordCount)

{
  spv_diagnostic diag;
  spv_diagnostic local_10;
  
  (this->name_for_id_)._M_h._M_buckets = &(this->name_for_id_)._M_h._M_single_bucket;
  (this->name_for_id_)._M_h._M_bucket_count = 1;
  (this->name_for_id_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->name_for_id_)._M_h._M_element_count = 0;
  (this->name_for_id_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->name_for_id_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->name_for_id_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->used_names_)._M_h._M_buckets = &(this->used_names_)._M_h._M_single_bucket;
  (this->used_names_)._M_h._M_bucket_count = 1;
  (this->used_names_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->used_names_)._M_h._M_element_count = 0;
  (this->used_names_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->used_names_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->used_names_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->grammar_).target_env_ = context->target_env;
  (this->grammar_).operandTable_ = context->operand_table;
  (this->grammar_).opcodeTable_ = context->opcode_table;
  (this->grammar_).extInstTable_ = context->ext_inst_table;
  local_10 = (spv_diagnostic)0x0;
  spvBinaryParse(context,this,code,wordCount,(spv_parsed_header_fn_t)0x0,ParseInstructionForwarder,
                 &local_10);
  spvDiagnosticDestroy(local_10);
  return;
}

Assistant:

FriendlyNameMapper::FriendlyNameMapper(const spv_const_context context,
                                       const uint32_t* code,
                                       const size_t wordCount)
    : grammar_(AssemblyGrammar(context)) {
  spv_diagnostic diag = nullptr;
  // We don't care if the parse fails.
  spvBinaryParse(context, this, code, wordCount, nullptr,
                 ParseInstructionForwarder, &diag);
  spvDiagnosticDestroy(diag);
}